

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O3

void __thiscall
indk::Neuron::doCreateNewSynapseCluster
          (Neuron *this,vector<float,_std::allocator<float>_> *PosVector,uint R,float k1,int64_t Tl,
          int NT)

{
  undefined8 uVar1;
  pointer ppVar2;
  long lVar3;
  pointer EName;
  double dVar4;
  undefined1 auVar5 [16];
  initializer_list<float> __l;
  allocator_type local_a5;
  float local_a4;
  float local_a0;
  float local_9c;
  double local_98;
  undefined8 local_90;
  undefined4 local_88;
  vector<float,_std::allocator<float>_> local_80;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  EName = (this->Entries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)ppVar2 - (long)EName;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x3333333333333333;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    local_a4 = (float)(360.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
    local_58 = (double)R;
    uVar1 = *(undefined8 *)
             (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = (double)(float)uVar1;
    dStack_60 = (double)(float)((ulong)uVar1 >> 0x20);
    local_9c = 0.0;
    local_a0 = k1;
    dStack_50 = local_58;
    do {
      local_98 = (double)(local_9c / 180.0) * 3.141592653589793;
      local_48 = cos(local_98);
      dVar4 = sin(local_98);
      local_90 = CONCAT44((float)(dVar4 * dStack_50 + dStack_60),
                          (float)(local_48 * local_58 + local_68));
      local_88 = 0;
      __l._M_len = 3;
      __l._M_array = (iterator)&local_90;
      std::vector<float,_std::allocator<float>_>::vector(&local_80,__l,&local_a5);
      doCreateNewSynapse(this,&EName->first,&local_80,local_a0,Tl,NT);
      if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_9c = local_9c + local_a4;
      EName = EName + 1;
    } while (EName != ppVar2);
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapseCluster(const std::vector<float>& PosVector, unsigned R, float k1, int64_t Tl, int NT) {
    float x = PosVector[0];
    float y = PosVector[1];

    float dfi = 360. / Entries.size();
    float fi = 0;
    float xr, yr;
    for (auto &ne: Entries) {
        xr = x + R * cos(fi/180*M_PI);
        yr = y + R * sin(fi/180*M_PI);
        doCreateNewSynapse(ne.first, {xr, yr, 0}, k1, Tl, NT);
        fi += dfi;
    }
}